

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcCoveringType::~IfcCoveringType(IfcCoveringType *this)

{
  ~IfcCoveringType((IfcCoveringType *)&this[-1].field_0x48);
  return;
}

Assistant:

IfcCoveringType() : Object("IfcCoveringType") {}